

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

TokenKind slang::syntax::SyntaxFacts::getDelimCloseKind(TokenKind kind)

{
  if ((ushort)(kind - ApostropheOpenBrace) < 6) {
    return *(TokenKind *)(&DAT_005454f8 + (ulong)(ushort)(kind - ApostropheOpenBrace) * 2);
  }
  return Unknown;
}

Assistant:

parsing::TokenKind SyntaxFacts::getDelimCloseKind(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenParenthesis: return TokenKind::CloseParenthesis;
        case TokenKind::OpenBrace: return TokenKind::CloseBrace;
        case TokenKind::OpenBracket: return TokenKind::CloseBracket;
        case TokenKind::ApostropheOpenBrace: return TokenKind::CloseBrace;
        default: return TokenKind::Unknown;
    }
}